

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O2

Optional<Corrade::Utility::JsonView<Corrade::Utility::JsonObjectItem>_> * __thiscall
Corrade::Utility::Json::parseObject
          (Optional<Corrade::Utility::JsonView<Corrade::Utility::JsonObjectItem>_>
           *__return_storage_ptr__,Json *this,JsonToken *token)

{
  ulong uVar1;
  bool bVar2;
  State *pSVar3;
  size_t sVar4;
  JsonToken *pJVar5;
  Debug *pDVar6;
  ostream *output;
  BasicStringView<const_char> string;
  Error err;
  
  pSVar3 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
  pJVar5 = (pSVar3->tokens)._data;
  pSVar3 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
  if ((pSVar3->tokens)._size <= (ulong)(((long)token - (long)pJVar5) / 0x18)) {
    output = Error::defaultOutput();
    Error::Error(&err,output,(Flags)0x0);
    Debug::operator<<(&err.super_Debug,
                      "Utility::Json::parseObject(): token not owned by the instance");
    Error::~Error(&err);
    abort();
  }
  uVar1 = token->_sizeFlagsParsedTypeType;
  if ((uint)(uVar1 >> 0x3d) == 1) {
    if ((uVar1 & 0x1c00000000000000) == 0) {
      token->_sizeFlagsParsedTypeType = uVar1 | 0x1c00000000000000;
    }
    sVar4 = JsonToken::childCount(token);
    for (pJVar5 = token + 1; pJVar5 != token + sVar4 + 1; pJVar5 = JsonToken::next(pJVar5)) {
      bVar2 = parseStringInternal(this,"Utility::Json::parseObject():",pJVar5);
      if (!bVar2) {
        __return_storage_ptr__->_set = false;
        return __return_storage_ptr__;
      }
    }
    JsonView<Corrade::Utility::JsonObjectItem>::JsonView
              ((JsonView<Corrade::Utility::JsonObjectItem> *)__return_storage_ptr__,token + 1,
               token + sVar4 + 1);
    __return_storage_ptr__->_set = true;
  }
  else {
    Error::Error(&err,(Flags)0x0);
    pDVar6 = Debug::operator<<(&err.super_Debug,
                               "Utility::Json::parseObject(): expected an object, got");
    pDVar6 = Utility::operator<<(pDVar6,token->_sizeFlagsParsedTypeType & (String|Object));
    Debug::operator<<(pDVar6,"at");
    pSVar3 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
    string = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                       (&pSVar3->string,token->_data);
    printFilePosition(this,&err.super_Debug,string);
    __return_storage_ptr__->_set = false;
    Error::~Error(&err);
  }
  return __return_storage_ptr__;
}

Assistant:

Containers::Optional<JsonObjectView> Json::parseObject(const JsonToken& token) {
    CORRADE_ASSERT(std::size_t(&token - _state->tokens) < _state->tokens.size(),
        "Utility::Json::parseObject(): token not owned by the instance", {});

    if(token.type() != JsonToken::Type::Object) {
        Error err;
        err << "Utility::Json::parseObject(): expected an object, got" << token.type() << "at";
        printFilePosition(err, _state->string.prefix(token._data));
        return {};
    }

    parseObjectArrayInternal(const_cast<JsonToken&>(token));

    const std::size_t childCount = token.childCount();
    for(JsonToken *i = const_cast<JsonToken*>(&token) + 1, *iMax = i + childCount; i != iMax; i = const_cast<JsonToken*>(i->next())) {
        if(!parseStringInternal("Utility::Json::parseObject():", *i)) return {};
    }

    return JsonObjectView{&token + 1, &token + 1 + childCount};
}